

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

void __thiscall t_st_generator::generate_service_client(t_st_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  ostream *poVar7;
  pointer pptVar8;
  string extends_client;
  string extends;
  string funname;
  string signature;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  string local_1a8;
  string local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  char *local_148;
  long local_140;
  char local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  string local_128;
  string local_108;
  char *local_e8;
  long local_e0;
  char local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  string local_c8;
  vector<t_function_*,_std::allocator<t_function_*>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"TClient","");
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_a8,&tservice->functions_);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_1a8,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1a8);
    paVar1 = &local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,local_1c8,local_1c8 + local_1c0);
    std::__cxx11::string::append((char *)&local_1a8);
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  out = &this->f_;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," subclass: #",0xc);
  client_class_name_abi_cxx11_(&local_50,this);
  prefix(&local_1a8,this,&local_50);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tinstanceVariableNames: \'\'\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tclassVariableNames: \'\'\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tpoolDictionaries: \'\'\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tcategory: \'",0xc);
  generated_category_abi_cxx11_(&local_108,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'!\n\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pptVar8 = local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar2 = ((*pptVar8)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + ((*pptVar8)->name_)._M_string_length);
      t_generator::camelcase(&local_1a8,(t_generator *)this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      function_signature_abi_cxx11_(&local_108,this,*pptVar8);
      client_class_name_abi_cxx11_(&local_70,this);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      st_method(this,(ostream *)out,&local_70,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      function_types_comment_abi_cxx11_(&local_128,this,*pptVar8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,local_128._M_dataplus._M_p,local_128._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_188._M_dataplus._M_p,local_188._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"self send",9);
      local_148 = &local_138;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      pcVar4 = local_148;
      iVar6 = toupper((int)*local_148);
      *pcVar4 = (char)iVar6;
      lVar5 = local_140;
      local_e8 = &local_d8;
      if (local_148 == &local_138) {
        uStack_d0 = uStack_130;
      }
      else {
        local_e8 = local_148;
      }
      _local_d8 = CONCAT71(uStack_137,local_138);
      local_e0 = local_140;
      local_140 = 0;
      local_138 = '\0';
      local_148 = &local_138;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_e8,lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((*pptVar8)->oneway_ == false) {
        t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,local_128._M_dataplus._M_p,local_128._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"^ self recv",0xb);
        local_168 = &local_158;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_1a8._M_dataplus._M_p,
                   local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
        paVar1 = local_168;
        iVar6 = toupper((int)local_168->_M_local_buf[0]);
        paVar1->_M_local_buf[0] = (char)iVar6;
        sVar3 = local_160;
        if (local_168 == &local_158) {
          local_188.field_2._8_8_ = local_158._8_8_;
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188._M_dataplus._M_p = (pointer)local_168;
        }
        local_188.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
        local_188.field_2._M_local_buf[0] = local_158._M_local_buf[0];
        local_188._M_string_length = local_160;
        local_160 = 0;
        local_158._M_local_buf[0] = '\0';
        local_168 = &local_158;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_188._M_dataplus._M_p,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," success ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
      }
      st_close_method(this,(ostream *)out);
      generate_send_method(this,*pptVar8);
      if ((*pptVar8)->oneway_ == false) {
        generate_recv_method(this,*pptVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return;
}

Assistant:

void t_st_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "TClient";
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = extends + "Client";
  }

  f_ << extends_client << " subclass: #" << prefix(client_class_name()) << endl
     << "\tinstanceVariableNames: ''\n"
     << "\tclassVariableNames: ''\n"
     << "\tpoolDictionaries: ''\n"
     << "\tcategory: '" << generated_category() << "'!\n\n";

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = camelcase((*f_iter)->get_name());
    string signature = function_signature(*f_iter);

    st_method(f_, client_class_name(), signature);
    f_ << function_types_comment(*f_iter) << endl << indent() << "self send"
       << capitalize(signature) << "." << endl;

    if (!(*f_iter)->is_oneway()) {
      f_ << indent() << "^ self recv" << capitalize(funname) << " success " << endl;
    }

    st_close_method(f_);

    generate_send_method(*f_iter);
    if (!(*f_iter)->is_oneway()) {
      generate_recv_method(*f_iter);
    }
  }
}